

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar12;
  size_t sVar4;
  int *piVar5;
  Allocator *pAVar6;
  void *pvVar7;
  void *pvVar8;
  float *pfVar9;
  void *pvVar10;
  size_t sVar11;
  undefined1 auVar13 [16];
  void *pvVar14;
  int iVar15;
  void *pvVar16;
  ulong uVar17;
  size_t totalsize;
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  void *pvVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  float fVar27;
  int *out;
  void *ptr;
  void *local_108;
  void *local_a8;
  size_t sStack_98;
  Allocator *local_88;
  ulong local_70;
  void *local_58;
  Allocator *pAStack_50;
  Allocator *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  iVar20 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar12 = bottom_blob->c;
  sVar4 = bottom_blob->elemsize;
  Mat::create(top_blob,this->num_output,sVar4,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  uVar24 = uVar3 * iVar20;
  if (this->use_int8_inference == false) {
    iVar21 = this->num_output;
    if (0 < (long)iVar21) {
      iVar19 = this->bias_term;
      iVar2 = this->activation_type;
      pvVar7 = (this->bias_data).data;
      pvVar8 = (this->weight_data).data;
      pvVar23 = bottom_blob->data;
      sVar4 = bottom_blob->cstep;
      pfVar9 = (float *)(this->activation_params).data;
      pvVar10 = top_blob->data;
      sVar11 = bottom_blob->elemsize;
      iVar15 = 0;
      lVar18 = 0;
      do {
        fVar27 = 0.0;
        if (iVar19 != 0) {
          fVar27 = *(float *)((long)pvVar7 + lVar18 * 4);
        }
        if (0 < (int)uVar12) {
          pvVar14 = (void *)((long)pvVar8 + (long)iVar15 * 4);
          uVar22 = 0;
          pvVar16 = pvVar23;
          do {
            if (0 < (int)uVar24) {
              uVar17 = 0;
              do {
                fVar27 = fVar27 + *(float *)((long)pvVar14 + uVar17 * 4) *
                                  *(float *)((long)pvVar16 + uVar17 * 4);
                uVar17 = uVar17 + 1;
              } while (uVar24 != uVar17);
            }
            uVar22 = uVar22 + 1;
            pvVar14 = (void *)((long)pvVar14 + (long)(int)uVar24 * 4);
            pvVar16 = (void *)((long)pvVar16 + sVar4 * sVar11);
          } while (uVar22 != (uint)uVar12);
        }
        switch(iVar2) {
        case 1:
          if (fVar27 <= 0.0) {
            fVar27 = 0.0;
          }
          break;
        case 2:
          fVar27 = fVar27 * (float)(~-(uint)(0.0 < fVar27) & (uint)*pfVar9 |
                                   -(uint)(0.0 < fVar27) & 0x3f800000);
          break;
        case 3:
          if (fVar27 <= *pfVar9) {
            fVar27 = *pfVar9;
          }
          if (pfVar9[1] < fVar27) {
            fVar27 = pfVar9[1];
          }
          break;
        case 4:
          fVar27 = expf(-fVar27);
          fVar27 = 1.0 / (fVar27 + 1.0);
        }
        *(float *)((long)pvVar10 + lVar18 * 4) = fVar27;
        lVar18 = lVar18 + 1;
        iVar15 = iVar15 + uVar3 * uVar12 * iVar20;
      } while (lVar18 != iVar21);
    }
    return 0;
  }
  local_a8 = bottom_blob->data;
  piVar5 = bottom_blob->refcount;
  sStack_98 = bottom_blob->elemsize;
  pAVar6 = bottom_blob->allocator;
  local_70 = bottom_blob->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  local_88 = pAVar6;
  if (sVar4 != 1) {
    local_88 = opt->workspace_allocator;
    auVar13._4_4_ = -(uint)(uVar3 == 0);
    auVar13._0_4_ = -(uint)(iVar20 == 0);
    auVar13._8_4_ = -(uint)(uVar12 == 0);
    auVar13._12_4_ = 0;
    movmskps((int)local_70,auVar13 << 0x20);
    local_108 = (void *)0x0;
    piVar1 = (int *)0x0;
    local_70 = (long)(int)uVar24 + 0xfU & 0xfffffffffffffff0;
    uVar22 = (long)(int)uVar12 * local_70;
    if (uVar22 != 0) {
      if (local_88 == (Allocator *)0x0) {
        local_58 = (void *)0x0;
        iVar21 = posix_memalign(&local_58,0x10,uVar22 | 4);
        local_108 = local_58;
        if (iVar21 != 0) {
          local_58 = (void *)0x0;
          local_108 = local_58;
        }
      }
      else {
        local_108 = (void *)(**(code **)(*(long *)local_88 + 0x10))(local_88,uVar22 | 4);
      }
      piVar1 = (int *)((long)local_108 + uVar22);
      *(undefined4 *)((long)local_108 + uVar22) = 1;
    }
    if (local_108 == (void *)0x0 || (long)(int)uVar12 * local_70 == 0) {
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_88 == (Allocator *)0x0) {
            if (local_108 != (void *)0x0) {
              free(local_108);
            }
          }
          else {
            (**(code **)(*(long *)local_88 + 0x18))();
          }
        }
      }
      iVar20 = -100;
      local_88 = pAVar6;
      goto LAB_001306f6;
    }
    local_58 = *(void **)opt;
    local_48 = opt->workspace_allocator;
    uStack_40._0_1_ = opt->use_winograd_convolution;
    uStack_40._1_1_ = opt->use_sgemm_convolution;
    uStack_40._2_1_ = opt->use_int8_inference;
    uStack_40._3_1_ = opt->use_vulkan_compute;
    uStack_40._4_1_ = opt->use_fp16_packed;
    uStack_40._5_1_ = opt->use_fp16_storage;
    uStack_40._6_1_ = opt->use_fp16_arithmetic;
    uStack_40._7_1_ = opt->use_int8_storage;
    local_38._0_1_ = opt->use_int8_arithmetic;
    local_38._1_1_ = opt->use_packing_layout;
    local_38._2_6_ = *(undefined6 *)&opt->field_0x22;
    pAStack_50 = local_88;
    (*this->quantize->_vptr_Layer[7])(this->quantize,bottom_blob);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (pAVar6 == (Allocator *)0x0) {
          if (local_a8 != (void *)0x0) {
            free(local_a8);
          }
        }
        else {
          (**(code **)(*(long *)pAVar6 + 0x18))();
        }
      }
    }
    local_a8 = local_108;
    sStack_98 = 1;
    piVar5 = piVar1;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_88 == (Allocator *)0x0) {
          if (local_108 != (void *)0x0) {
            free(local_108);
          }
        }
        else {
          (**(code **)(*(long *)local_88 + 0x18))();
        }
      }
    }
  }
  uVar25 = this->num_output;
  if (0 < (int)uVar25) {
    pvVar7 = top_blob->data;
    pvVar8 = (this->weight_data).data;
    iVar21 = 0;
    lVar18 = 0;
    do {
      iVar19 = 0;
      if (0 < (int)uVar12) {
        lVar26 = (long)iVar21 + (long)pvVar8;
        uVar22 = 0;
        iVar19 = 0;
        pvVar23 = local_a8;
        do {
          if (0 < (int)uVar24) {
            uVar17 = 0;
            do {
              iVar19 = iVar19 + (int)*(char *)(lVar26 + uVar17) *
                                (int)*(char *)((long)pvVar23 + uVar17);
              uVar17 = uVar17 + 1;
            } while (uVar24 != uVar17);
          }
          uVar22 = uVar22 + 1;
          lVar26 = lVar26 + (int)uVar24;
          pvVar23 = (void *)((long)pvVar23 + local_70 * sStack_98);
        } while (uVar22 != (uint)uVar12);
      }
      *(int *)((long)pvVar7 + lVar18 * 4) = iVar19;
      lVar18 = lVar18 + 1;
      uVar25 = this->num_output;
      iVar21 = iVar21 + uVar3 * uVar12 * iVar20;
    } while (lVar18 < (int)uVar25);
  }
  if (0 < (int)uVar25) {
    pvVar7 = top_blob->data;
    pvVar8 = (this->weight_data_int8_scales).data;
    iVar20 = this->bias_term;
    iVar21 = this->activation_type;
    pvVar23 = (this->bias_data).data;
    uVar22 = 0;
    do {
      fVar27 = *(float *)((long)pvVar8 + uVar22 * 4);
      fVar27 = (float)*(int *)((long)pvVar7 + uVar22 * 4) *
               (float)(~-(uint)(fVar27 == 0.0) &
                      (uint)(1.0 / (this->bottom_blob_int8_scale * fVar27)));
      if (iVar20 != 0) {
        fVar27 = fVar27 + *(float *)((long)pvVar23 + uVar22 * 4);
      }
      *(float *)((long)pvVar7 + uVar22 * 4) = fVar27;
      if (iVar21 == 1) {
        fVar27 = *(float *)((long)pvVar7 + uVar22 * 4);
        if (fVar27 <= 0.0) {
          fVar27 = 0.0;
        }
        *(float *)((long)pvVar7 + uVar22 * 4) = fVar27;
      }
      uVar22 = uVar22 + 1;
    } while (uVar25 != uVar22);
  }
  iVar20 = 0;
LAB_001306f6:
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_88 == (Allocator *)0x0) {
        if (local_a8 != (void *)0x0) {
          free(local_a8);
        }
      }
      else {
        (**(code **)(*(long *)local_88 + 0x18))();
      }
    }
  }
  return iVar20;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (use_int8_inference)
    {
        Mat bottom_blob_tm = bottom_blob;
        if (elemsize != 1)
        {
            Mat bottom_blob_int8;
            bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
            if (bottom_blob_int8.empty())
                return -100;

            // quantize, scale and round to nearest
            {
                Option opt_g = opt;
                opt_g.blob_allocator = bottom_blob_int8.allocator;

                quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
            }

            bottom_blob_tm = bottom_blob_int8;
        }

        // num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int sum = 0;
            int* out = top_blob;

            // channels
            for (int q=0; q<channels; q++)
            {
                const signed char* w = (const signed char*)weight_data + size * channels * p + size * q;
                const signed char* m = bottom_blob_tm.channel(q);

                for (int i = 0; i < size; i++)
                {
                    sum += m[i] * w[i];
                }
            }

            out[p] = sum;       
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int* out_s32 = top_blob;
            float* out_f32 = top_blob;
            float top_rescale = 1.f;
            if (weight_data_int8_scales[p] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

            if (bias_term)
                out_f32[p] = out_s32[p] * top_rescale + bias_data[p];
            else
                out_f32[p] = out_s32[p] * top_rescale;

            if (activation_type == 1)
            {
                out_f32[p] = std::max(out_f32[p], 0.f);
            }                
        }

        return 0;
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q=0; q<channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        if (activation_type == 1)
        {
            sum = std::max(sum, 0.f);
        }
        else if (activation_type == 2)
        {
            float slope = activation_params[0];
            sum = sum > 0.f ? sum : sum * slope;
        }
        else if (activation_type == 3)
        {
            float min = activation_params[0];
            float max = activation_params[1];
            if (sum < min)
                sum = min;
            if (sum > max)
                sum = max;
        }
        else if (activation_type == 4)
        {
            sum = 1.f / (1.f + exp(-sum));
        }

        top_blob[p] = sum;
    }

    return 0;
}